

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromBarBufs(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  long *plVar4;
  Nm_Man_t *pNVar5;
  Abc_Ntk_t *pAVar6;
  Abc_Des_t *pAVar7;
  void **ppvVar8;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar9;
  char *pcVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  undefined8 uVar16;
  long lVar17;
  int iVar18;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  Vec_Ptr_t *local_40;
  Vec_Ptr_t *local_38;
  
  if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
    __assert_fail("pNtkBase->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10d,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10e,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10f,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x110,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != pNtk->nBarBufs) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x111,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x112,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x113,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPis->nSize != pNtkBase->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x114,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkBase->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x115,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy_rec(pNtkBase);
  pVVar11 = pNtkBase->pDesign->vModules;
  uVar15 = pVVar11->nSize;
  if (0 < (int)uVar15) {
    lVar17 = 0;
    do {
      pAVar1 = (Abc_Ntk_t *)pVVar11->pArray[lVar17];
      pAVar6 = Abc_NtkStartFrom(pAVar1,pNtk->ntkType,pNtk->ntkFunc);
      pAVar1->pCopy = pAVar6;
      lVar17 = lVar17 + 1;
      pVVar11 = pNtkBase->pDesign->vModules;
      uVar15 = pVVar11->nSize;
    } while (lVar17 < (int)uVar15);
  }
  if (0 < (int)uVar15) {
    ppvVar8 = pVVar11->pArray;
    uVar12 = 0;
    do {
      lVar17 = *(long *)((long)ppvVar8[uVar12] + 0xb8);
      if (lVar17 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = *(undefined8 *)(lVar17 + 0x160);
      }
      *(undefined8 *)(*(long *)((long)ppvVar8[uVar12] + 0x160) + 0xb8) = uVar16;
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  pAVar7 = pNtkBase->pDesign;
  pVVar11 = pAVar7->vModules;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      pvVar2 = pVVar11->pArray[lVar17];
      lVar14 = *(long *)((long)pvVar2 + 0x50);
      if (0 < *(int *)(lVar14 + 4)) {
        lVar13 = 0;
        do {
          lVar14 = *(long *)(*(long *)(lVar14 + 8) + lVar13 * 8);
          uVar15 = *(uint *)(lVar14 + 0x14) & 0xf;
          if (uVar15 == 9) {
            *(undefined8 *)(*(long *)(lVar14 + 0x40) + 0x38) =
                 *(undefined8 *)(*(long *)(lVar14 + 0x38) + 0x160);
          }
          else if (uVar15 == 10) {
            __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
          }
          lVar13 = lVar13 + 1;
          lVar14 = *(long *)((long)pvVar2 + 0x50);
        } while (lVar13 < *(int *)(lVar14 + 4));
      }
      lVar17 = lVar17 + 1;
      pAVar7 = pNtkBase->pDesign;
      pVVar11 = pAVar7->vModules;
    } while (lVar17 < pVVar11->nSize);
  }
  pAVar1 = pNtkBase->pCopy;
  pAVar7 = Abc_DesCreate(pAVar7->pName);
  pAVar1->pDesign = pAVar7;
  pVVar11 = pNtkBase->pDesign->vModules;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      Abc_DesAddModel(pAVar1->pDesign,*(Abc_Ntk_t **)((long)pVVar11->pArray[lVar17] + 0x160));
      lVar17 = lVar17 + 1;
      pVVar11 = pNtkBase->pDesign->vModules;
    } while (lVar17 < pVVar11->nSize);
  }
  pVVar11 = pNtkBase->pDesign->vTops;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      pVVar3 = pAVar1->pDesign->vTops;
      pvVar2 = *(void **)((long)pVVar11->pArray[lVar17] + 0x160);
      uVar15 = pVVar3->nCap;
      if (pVVar3->nSize == uVar15) {
        if ((int)uVar15 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar8;
          iVar18 = 0x10;
        }
        else {
          iVar18 = uVar15 * 2;
          if (iVar18 <= (int)uVar15) goto LAB_008439c4;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar15 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar3->pArray,(ulong)uVar15 << 4);
          }
          pVVar3->pArray = ppvVar8;
        }
        pVVar3->nCap = iVar18;
      }
LAB_008439c4:
      iVar18 = pVVar3->nSize;
      pVVar3->nSize = iVar18 + 1;
      pVVar3->pArray[iVar18] = pvVar2;
      lVar17 = lVar17 + 1;
      pVVar11 = pNtkBase->pDesign->vTops;
    } while (lVar17 < pVVar11->nSize);
  }
  pVVar11 = pAVar1->pDesign->vTops;
  if (0 < pVVar11->nSize) {
    if ((Abc_Ntk_t *)*pVVar11->pArray != pAVar1) {
      __assert_fail("Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x128,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Abc_NtkCleanCopy(pNtk);
    pVVar11 = pNtk->vPis;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        if (pAVar1->vPis->nSize <= lVar17) goto LAB_00843d65;
        *(void **)((long)pVVar11->pArray[lVar17] + 0x40) = pAVar1->vPis->pArray[lVar17];
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vPis;
      } while (lVar17 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vPos;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        if (pAVar1->vPos->nSize <= lVar17) goto LAB_00843d65;
        *(void **)((long)pVVar11->pArray[lVar17] + 0x40) = pAVar1->vPos->pArray[lVar17];
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vPos;
      } while (lVar17 < pVVar11->nSize);
    }
    Abc_NtkCollectPiPos(pNtkBase,&local_38,&local_40);
    if (local_38->nSize != pNtk->nObjCounts[8]) {
      __assert_fail("Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x130,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (local_40->nSize != pNtk->nObjCounts[8]) {
      __assert_fail("Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x131,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (0 < local_38->nSize) {
      lVar17 = 0;
      do {
        if ((local_40->nSize <= lVar17) || (pNtk->vBoxes->nSize <= lVar17)) goto LAB_00843d65;
        pvVar2 = local_40->pArray[lVar17];
        plVar4 = (long *)pNtk->vBoxes->pArray[lVar17];
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8) + 0x40)
             = *(undefined8 *)((long)local_38->pArray[lVar17] + 0x40);
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8) + 0x40)
             = *(undefined8 *)((long)pvVar2 + 0x40);
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_38->nSize);
    }
    if (local_38->pArray != (void **)0x0) {
      free(local_38->pArray);
      local_38->pArray = (void **)0x0;
    }
    if (local_38 != (Vec_Ptr_t *)0x0) {
      free(local_38);
    }
    if (local_40->pArray != (void **)0x0) {
      free(local_40->pArray);
      local_40->pArray = (void **)0x0;
    }
    if (local_40 != (Vec_Ptr_t *)0x0) {
      free(local_40);
    }
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar17];
        pAVar9 = (Abc_Obj_t *)plVar4[8];
        pFanin = Abc_NtkFromBarBufs_rec
                           (pAVar9->pNtk,
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8
                             ));
        Abc_ObjAddFanin(pAVar9,pFanin);
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar17 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vCis;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar17];
        if (*(int *)(plVar4[8] + 0x2c) == 0) {
          pAVar9 = Abc_NtkCreateObj(*(Abc_Ntk_t **)plVar4[8],ABC_OBJ_NET);
          Abc_ObjAddFanin(pAVar9,(Abc_Obj_t *)plVar4[8]);
        }
        lVar14 = *(long *)plVar4[8];
        pNVar5 = *(Nm_Man_t **)(lVar14 + 0x18);
        lVar14 = *(long *)(*(long *)(*(long *)(lVar14 + 0x20) + 8) +
                          (long)*(int *)((long *)plVar4[8])[6] * 8);
        iVar18 = *(int *)(lVar14 + 0x10);
        uVar15 = *(uint *)(lVar14 + 0x14);
        pcVar10 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[6] * 8));
        Nm_ManStoreIdName(pNVar5,iVar18,uVar15 & 0xf,pcVar10,(char *)0x0);
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar17 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        plVar4 = (long *)pVVar11->pArray[lVar17];
        lVar14 = *(long *)plVar4[8];
        pNVar5 = *(Nm_Man_t **)(lVar14 + 0x18);
        lVar14 = *(long *)(*(long *)(*(long *)(lVar14 + 0x20) + 8) +
                          (long)*(int *)((long *)plVar4[8])[4] * 8);
        iVar18 = *(int *)(lVar14 + 0x10);
        uVar15 = *(uint *)(lVar14 + 0x14);
        pcVar10 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[4] * 8));
        Nm_ManStoreIdName(pNVar5,iVar18,uVar15 & 0xf,pcVar10,(char *)0x0);
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar17 < pVVar11->nSize);
    }
    return pAVar1;
  }
LAB_00843d65:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromBarBufs( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k;
    assert( pNtkBase->pDesign != NULL );
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkIsNetlist(pNtkBase) );
    assert( Abc_NtkLatchNum(pNtkBase) == 0 );
    assert( Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase) );
    // start networks
    Abc_NtkCleanCopy_rec( pNtkBase );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy = Abc_NtkStartFrom( pTemp, pNtk->ntkType, pNtk->ntkFunc );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    // create the design
    pNtkNew = pNtkBase->pCopy;
    pNtkNew->pDesign = Abc_DesCreate( pNtkBase->pDesign->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_DesAddModel( pNtkNew->pDesign, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vTops, pTemp, i )
        Vec_PtrPush( pNtkNew->pDesign->vTops, pTemp->pCopy );
    assert( Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew );
    // transfer copy attributes to pNtk
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPo(pNtkNew, i);
    Abc_NtkCollectPiPos( pNtkBase, &vLiMaps, &vLoMaps );
    assert( Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk) );
    assert( Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk) );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObj = Abc_NtkBox( pNtk, i );
        Abc_ObjFanin0(pObj)->pCopy = pLiMap->pCopy; 
        Abc_ObjFanout0(pObj)->pCopy = pLoMap->pCopy; 
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // create internal nodes
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pObj->pCopy->pNtk, Abc_ObjFanin0(pObj)) );
    // transfer net names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj->pCopy) == 0 ) // handle PI without fanout
            Abc_ObjAddFanin( Abc_NtkCreateNet(pObj->pCopy->pNtk), pObj->pCopy );
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanout0(pObj->pCopy)->Id, Abc_ObjFanout0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanin0(pObj->pCopy)->Id, Abc_ObjFanin0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanin0(pObj)), NULL );
    return pNtkNew;
}